

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O2

unsigned_long
getU<unsigned_long>(uint64_t *offset_ptr,DataExtractor *de,bool isLittleEndian,char *Data,Error *Err
                   )

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ErrorAsOutParameter local_38;
  ErrorAsOutParameter ErrAsOut;
  
  if (Err != (Error *)0x0) {
    uVar3 = (ulong)Err->Payload & 0xfffffffffffffffe;
    Err->Payload = (ErrorInfoBase *)(uVar3 != 0 | uVar3);
  }
  local_38.Err = Err;
  bVar2 = isError(Err);
  if (!bVar2) {
    uVar3 = *offset_ptr;
    if ((uVar3 < 0xfffffffffffffff8) && (uVar3 + 7 < (de->Data).Length)) {
      uVar1 = *(ulong *)(Data + uVar3);
      uVar4 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      if (isLittleEndian) {
        uVar4 = uVar1;
      }
      *offset_ptr = uVar3 + 8;
      goto LAB_00d673f1;
    }
    unexpectedEndReached(Err);
  }
  uVar4 = 0;
LAB_00d673f1:
  llvm::ErrorAsOutParameter::~ErrorAsOutParameter(&local_38);
  return uVar4;
}

Assistant:

static T getU(uint64_t *offset_ptr, const DataExtractor *de,
              bool isLittleEndian, const char *Data, llvm::Error *Err) {
  ErrorAsOutParameter ErrAsOut(Err);
  T val = 0;
  if (isError(Err))
    return val;

  uint64_t offset = *offset_ptr;
  if (!de->isValidOffsetForDataOfSize(offset, sizeof(T))) {
    unexpectedEndReached(Err);
    return val;
  }
  std::memcpy(&val, &Data[offset], sizeof(val));
  if (sys::IsLittleEndianHost != isLittleEndian)
    sys::swapByteOrder(val);

  // Advance the offset
  *offset_ptr += sizeof(val);
  return val;
}